

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O2

int ARKBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                    void *bp_data)

{
  ARKodeMem ark_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  code *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *msgfmt;
  long j;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double local_c0;
  long local_b0;
  double local_a8;
  long local_98;
  
  ark_mem = *(ARKodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar6 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x165;
      goto LAB_00121ccc;
    }
    if (iVar6 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bp_data + 0x30);
    uVar2 = *(undefined8 *)((long)bp_data + 0x38);
    lVar3 = *(long *)((long)bp_data + 0x48);
    pcVar7 = (code *)(**(code **)(lVar3 + 0x130))(lVar3);
    if (pcVar7 == (code *)0x0) {
LAB_00121caa:
      msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
      iVar6 = 0x16e;
      goto LAB_00121ccc;
    }
    lVar8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x210));
    lVar9 = N_VGetArrayPointer(fy);
    lVar10 = N_VGetArrayPointer(uVar1);
    lVar11 = N_VGetArrayPointer(y);
    lVar12 = N_VGetArrayPointer(uVar2);
    if (*(int *)(lVar3 + 0x80) == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x270));
    }
    N_VScale(0x3ff0000000000000,y,uVar2);
    dVar21 = *(double *)(lVar3 + 8);
    local_c0 = 0.0;
    if (0.0 < dVar21) {
      if (dVar21 < 0.0) {
        local_c0 = sqrt(dVar21);
      }
      else {
        local_c0 = SQRT(dVar21);
      }
    }
    dVar21 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar3 + 0x218));
    lVar16 = *bp_data;
    local_a8 = 1.0;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      local_a8 = dVar21 * (double)lVar16 *
                          ABS(*(double *)(lVar3 + 0x2a0)) * 1000.0 * *(double *)(lVar3 + 8);
    }
    lVar4 = *(long *)((long)bp_data + 8);
    lVar5 = *(long *)((long)bp_data + 0x10);
    lVar20 = lVar4 + lVar5 + 1;
    lVar18 = lVar16;
    if (lVar20 < lVar16) {
      lVar18 = lVar20;
    }
    if (lVar18 < 1) {
      lVar18 = 0;
    }
    local_98 = 0;
    for (lVar15 = 1; lVar15 != lVar18 + 1; lVar15 = lVar15 + 1) {
      j = lVar15 + -1;
      for (lVar13 = j; lVar13 < lVar16; lVar13 = lVar13 + lVar20) {
        dVar21 = *(double *)(lVar11 + lVar13 * 8);
        dVar22 = local_a8 / *(double *)(lVar8 + lVar13 * 8);
        dVar24 = ABS(dVar21) * local_c0;
        if (dVar24 <= dVar22) {
          dVar24 = dVar22;
        }
        if (*(int *)(lVar3 + 0x80) != 0) {
          dVar22 = *(double *)(local_b0 + lVar13 * 8);
          dVar23 = ABS(dVar22);
          dVar21 = dVar21 + dVar24;
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0)))) goto LAB_00121ab2;
          }
          else if (dVar21 * dVar22 < 0.0) {
LAB_00121ab2:
            dVar24 = -dVar24;
          }
        }
        *(double *)(lVar12 + lVar13 * 8) = dVar24 + *(double *)(lVar12 + lVar13 * 8);
      }
      iVar6 = (*pcVar7)(uVar2,uVar1,*(undefined8 *)(lVar3 + 0x10));
      *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
      if (iVar6 != 0) {
        if (-1 < iVar6) {
          return 1;
        }
        goto LAB_00121caa;
      }
      lVar16 = *bp_data;
      lVar13 = local_98;
      for (; j < lVar16; j = j + lVar20) {
        dVar21 = *(double *)(lVar11 + j * 8);
        *(double *)(lVar12 + j * 8) = dVar21;
        psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
        dVar22 = local_a8 / *(double *)(lVar8 + j * 8);
        dVar24 = ABS(*(double *)(lVar11 + j * 8)) * local_c0;
        if (dVar24 <= dVar22) {
          dVar24 = dVar22;
        }
        if (*(int *)(lVar3 + 0x80) != 0) {
          dVar22 = *(double *)(local_b0 + j * 8);
          dVar23 = ABS(dVar22);
          dVar21 = dVar21 + dVar24;
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) && ((!NAN(dVar23) && (dVar21 * dVar22 <= 0.0)))) goto LAB_00121bfd;
          }
          else if (dVar21 * dVar22 < 0.0) {
LAB_00121bfd:
            dVar24 = -dVar24;
          }
        }
        lVar17 = j - *(long *)((long)bp_data + 0x10);
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        lVar19 = *(long *)((long)bp_data + 8) + j;
        lVar16 = *bp_data;
        if (lVar16 + -1 <= lVar19) {
          lVar19 = lVar16 + -1;
        }
        for (; lVar17 <= lVar19; lVar17 = lVar17 + 1) {
          *(double *)((long)psVar14 + lVar17 * 8 + lVar13) =
               (*(double *)(lVar10 + lVar17 * 8) - *(double *)(lVar9 + lVar17 * 8)) * (1.0 / dVar24)
          ;
        }
        lVar13 = lVar13 + ~(lVar4 + lVar5) * 8;
      }
      local_98 = local_98 + -8;
    }
    iVar6 = SUNMatCopy(t,*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20)
                      );
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x177;
      goto LAB_00121ccc;
    }
  }
  else {
    *jcurPtr = 0;
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x158;
      goto LAB_00121ccc;
    }
  }
  if (iVar6 != 0) {
    return 1;
  }
  iVar6 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar6 == 0) {
    iVar6 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar6;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar6 = 0x182;
LAB_00121ccc:
  arkProcessError(ark_mem,-1,iVar6,"ARKBandPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int ARKBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                            sunbooleantype jok, sunbooleantype* jcurPtr,
                            sunrealtype gamma, void* bp_data)
{
  ARKBandPrecData pdata;
  ARKodeMem ark_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (ARKBandPrecData)bp_data;

  ark_mem = (ARKodeMem)pdata->arkode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call ARKBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = ARKBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_BP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    arkProcessError(ark_mem, -1, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}